

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestP4.cxx
# Opt level: O0

void __thiscall cmCTestP4::UserParser::~UserParser(UserParser *this)

{
  UserParser *this_local;
  
  ~UserParser(this);
  operator_delete(this,0x118);
  return;
}

Assistant:

UserParser(cmCTestP4* p4, const char* prefix)
    : P4(p4)
  {
    this->SetLog(&P4->Log, prefix);
    this->RegexUser.compile("^(.+) <(.*)> \\((.*)\\) accessed (.*)$");
  }